

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,std::__cxx11::string>
          (ExtensionSet *this,char *ptr,MessageLite *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  char *ptr_00;
  _Alloc_hider _Var1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  MessageLite *pMVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  undefined4 extraout_var;
  uint uVar9;
  ParseContext *s;
  StringPiece val;
  char *ptr_local;
  bool was_packed_on_wire;
  uint32_t tag;
  InternalMetadata *local_108;
  char *p;
  uint64_t tmp;
  string payload;
  ExtensionInfo extension;
  ParseContext tmp_ctx;
  
  payload._M_dataplus._M_p = (pointer)&payload.field_2;
  payload._M_string_length = 0;
  payload.field_2._M_local_buf[0] = '\0';
  bVar3 = false;
  uVar9 = 0;
  ptr_local = ptr;
  local_108 = metadata;
LAB_003c9007:
  do {
    while( true ) {
      bVar2 = ParseContext::Done(ctx,&ptr_local);
      pcVar7 = ptr_local;
      if (bVar2) goto LAB_003c924c;
      ptr_00 = ptr_local + 1;
      tag = (uint32_t)(byte)*ptr_local;
      if (tag != 0x1a) break;
      if (uVar9 == 0) {
        ptr_local = ptr_00;
        uVar4 = ReadSize(&ptr_local);
        if (ptr_local == (char *)0x0) goto LAB_003c923b;
        ptr_local = EpsCopyInputStream::ReadString
                              (&ctx->super_EpsCopyInputStream,ptr_local,uVar4,&payload);
        uVar9 = 0;
        bVar3 = true;
      }
      else {
        ptr_local = ptr_00;
        ptr_local = ParseField(this,(ulong)uVar9 * 8 + 2,ptr_00,extendee,local_108,ctx);
        uVar9 = 0;
      }
LAB_003c9192:
      if (ptr_local == (char *)0x0) goto LAB_003c923b;
    }
    if (*ptr_local != 0x10) {
      ptr_local = ptr_00;
      ptr_local = ReadTag(pcVar7,&tag,0);
      if (((ulong)tag != 0) && ((tag & 7) != 4)) {
        ptr_local = ParseField(this,(ulong)tag,ptr_local,extendee,local_108,ctx);
        goto LAB_003c9192;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
      pcVar7 = ptr_local;
      goto LAB_003c924c;
    }
    ptr_local = ptr_00;
    ptr_local = ParseBigVarint(ptr_00,&tmp);
    uVar4 = (uint32_t)tmp;
    if (ptr_local == (char *)0x0) goto LAB_003c923b;
    if (!bVar3) {
      bVar3 = false;
      uVar9 = (uint32_t)tmp;
      goto LAB_003c9007;
    }
    extension.number = 0;
    extension.type = '\0';
    extension.is_repeated = false;
    extension.is_packed = false;
    extension.message._0_7_ = 0;
    extension.message._7_1_ = 0;
    extension.field_5.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
    extension.field_5.enum_validity_check.arg = (void *)0x0;
    extension.descriptor = (FieldDescriptor *)0x0;
    s = ctx;
    bVar3 = FindExtension(this,2,(uint32_t)tmp,extendee,ctx,&extension,&was_packed_on_wire);
    _Var1 = payload._M_dataplus;
    if (bVar3) {
      if (extension.is_repeated == true) {
        pMVar6 = AddMessage(this,uVar4,'\v',
                            (MessageLite *)extension.field_5.enum_validity_check.func,
                            extension.descriptor);
      }
      else {
        pMVar6 = MutableMessage(this,uVar4,'\v',
                                (MessageLite *)extension.field_5.enum_validity_check.func,
                                extension.descriptor);
      }
      ParseContext::ParseContext<std::__cxx11::string&>(&tmp_ctx,ctx->depth_,false,&p,&payload);
      tmp_ctx.data_.pool._0_4_ = *(undefined4 *)&(ctx->data_).pool;
      tmp_ctx.data_.pool._4_4_ = *(undefined4 *)((long)&(ctx->data_).pool + 4);
      tmp_ctx.data_.factory._0_4_ = *(undefined4 *)&(ctx->data_).factory;
      tmp_ctx.data_.factory._4_4_ = *(undefined4 *)((long)&(ctx->data_).factory + 4);
      iVar5 = (*pMVar6->_vptr_MessageLite[10])(pMVar6,p,&tmp_ctx);
      if (CONCAT44(extraout_var,iVar5) == 0) goto LAB_003c923b;
      bVar3 = true;
      uVar9 = 0;
      if (tmp_ctx.super_EpsCopyInputStream.last_tag_minus_1_ != 0) {
LAB_003c923b:
        pcVar7 = (char *)0x0;
LAB_003c924c:
        std::__cxx11::string::~string((string *)&payload);
        return pcVar7;
      }
    }
    else {
      pcVar7 = (char *)stringpiece_internal::StringPiece::CheckSize(payload._M_string_length);
      pbVar8 = InternalMetadata::mutable_unknown_fields<std::__cxx11::string>(local_108);
      val.length_ = (size_type)pbVar8;
      val.ptr_ = pcVar7;
      WriteLengthDelimited((internal *)(ulong)uVar4,(uint32_t)_Var1._M_p,val,(string *)s);
      bVar3 = true;
      uVar9 = 0;
    }
  } while( true );
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* extendee, internal::InternalMetadata* metadata,
    internal::ParseContext* ctx) {
  std::string payload;
  uint32_t type_id = 0;
  bool payload_read = false;
  while (!ctx->Done(&ptr)) {
    uint32_t tag = static_cast<uint8_t>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64_t tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (payload_read) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, extendee, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64_t>(type_id) * 8 + 2, ptr,
                                    extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32_t size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        payload_read = true;
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, extendee, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}